

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTetrahedronShape.cpp
# Opt level: O1

void __thiscall
cbtBU_Simplex1to4::getAabb
          (cbtBU_Simplex1to4 *this,cbtTransform *t,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  cbtPolyhedralConvexAabbCachingShape::getAabb
            (&this->super_cbtPolyhedralConvexAabbCachingShape,t,aabbMin,aabbMax);
  return;
}

Assistant:

void cbtBU_Simplex1to4::getAabb(const cbtTransform& t, cbtVector3& aabbMin, cbtVector3& aabbMax) const
{
#if 1
	cbtPolyhedralConvexAabbCachingShape::getAabb(t, aabbMin, aabbMax);
#else
	aabbMin.setValue(BT_LARGE_FLOAT, BT_LARGE_FLOAT, BT_LARGE_FLOAT);
	aabbMax.setValue(-BT_LARGE_FLOAT, -BT_LARGE_FLOAT, -BT_LARGE_FLOAT);

	//just transform the vertices in worldspace, and take their AABB
	for (int i = 0; i < m_numVertices; i++)
	{
		cbtVector3 worldVertex = t(m_vertices[i]);
		aabbMin.setMin(worldVertex);
		aabbMax.setMax(worldVertex);
	}
#endif
}